

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOWFileParser.cpp
# Opt level: O2

void __thiscall BOWFileParser::makeDocVoca(BOWFileParser *this)

{
  long lVar1;
  pointer pvVar2;
  ulong uVar3;
  int v;
  ulong uVar4;
  uint local_54;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> docVocad;
  
  local_50 = &this->_docVoca;
  uVar3 = 0;
  while( true ) {
    pvVar2 = (this->_frequencyMatrix).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_frequencyMatrix).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) <= uVar3)
    break;
    docVocad.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    docVocad.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    docVocad.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar4 = 0;
        lVar1 = *(long *)&pvVar2[uVar3].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data,
        uVar4 < (ulong)((long)*(pointer *)
                               ((long)&pvVar2[uVar3].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar1 >> 2);
        uVar4 = uVar4 + 1) {
      if (*(int *)(lVar1 + uVar4 * 4) != 0) {
        local_54 = (uint)uVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &docVocad.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                   &local_54);
        pvVar2 = (this->_frequencyMatrix).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(local_50,(value_type *)
                         &docVocad.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&docVocad.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void BOWFileParser::makeDocVoca(){//{{{
    for(int d=0; d<_frequencyMatrix.size(); d++){
        vector<unsigned int> docVocad;
        for(int v=0; v<_frequencyMatrix[d].size(); v++){
            if(_frequencyMatrix[d][v] > 0){
                docVocad.push_back(v);
            }
        }
        _docVoca.push_back(docVocad);
    }
}